

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

int __thiscall GF2::MP<9UL,_GF2::MOLex<9UL>_>::Deg(MP<9UL,_GF2::MOLex<9UL>_> *this)

{
  int iVar1;
  size_t weight;
  long lVar2;
  _List_node_base *p_Var3;
  int iVar4;
  
  if ((this->super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>).
      super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node._M_size == 0) {
    return -1;
  }
  p_Var3 = (this->super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>).
           super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)this) {
    iVar4 = 0;
    do {
      lVar2 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)(byte)WW<9ul>::Weight()::_bitsperoctet
                                    [*(ulong *)&((list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>
                                                  *)(p_Var3 + 1))->
                                                super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>
                                     >> ((byte)lVar2 & 0x3f) & 0xff];
        lVar2 = lVar2 + 8;
      } while (lVar2 == 8);
      if (iVar1 < iVar4) {
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      p_Var3 = (((list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_> *)&p_Var3->_M_next)->
               super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)this);
    return iVar4;
  }
  return 0;
}

Assistant:

bool IsEmpty() const
	{	
		return Size() == 0;
	}